

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFOutlineObjectHelper.hh
# Opt level: O2

QPDFOutlineObjectHelper *
QPDFOutlineObjectHelper::Accessor::create
          (QPDFOutlineObjectHelper *__return_storage_ptr__,QPDFObjectHandle *oh,
          QPDFOutlineDocumentHelper *dh,int depth)

{
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_30,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)oh);
  QPDFOutlineObjectHelper(__return_storage_ptr__,(QPDFObjectHandle *)&local_30,dh,depth);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

static QPDFOutlineObjectHelper
        create(QPDFObjectHandle oh, QPDFOutlineDocumentHelper& dh, int depth)
        {
            return {oh, dh, depth};
        }